

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void TldAsKey::CanonicCopy
               (uint8_t *tldDest,size_t tldDestMax,size_t *tldDestLength,uint8_t *tldSrce,
               size_t tldSrceLength)

{
  uint8_t uVar1;
  size_t sVar2;
  uint8_t uVar3;
  
  if (tldSrceLength < tldDestMax) {
    tldDestMax = tldSrceLength;
  }
  if (tldDestMax != 0) {
    sVar2 = 0;
    do {
      uVar1 = tldSrce[sVar2];
      uVar3 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar3 = uVar1;
      }
      tldDest[sVar2] = uVar3;
      sVar2 = sVar2 + 1;
    } while (tldDestMax != sVar2);
  }
  *tldDestLength = tldDestMax;
  tldDest[tldDestMax] = '\0';
  return;
}

Assistant:

void TldAsKey::CanonicCopy(uint8_t * tldDest, size_t tldDestMax, size_t * tldDestLength, 
    uint8_t * tldSrce, size_t tldSrceLength)
{
    size_t i = 0;

    for (; i < tldSrceLength && i < tldDestMax; i++)
    {
        int c = tldSrce[i];

        if (c >= 'a' && c <= 'z')
        {
            c += 'A' - 'a';
        }

        tldDest[i] = c;
    }

    *tldDestLength = i;

    tldDest[i] = 0;
}